

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::add
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item)

{
  long lVar1;
  CSkinPart *pCVar2;
  byte bVar3;
  
  bVar3 = 0;
  incsize(this);
  set_size(this,this->num_elements + 1);
  pCVar2 = this->list + (long)this->num_elements + -1;
  for (lVar1 = 0x1f; lVar1 != 0; lVar1 = lVar1 + -1) {
    pCVar2->m_Flags = item->m_Flags;
    item = (CSkinPart *)((long)item + (ulong)bVar3 * -8 + 4);
    pCVar2 = (CSkinPart *)((long)pCVar2 + ((ulong)bVar3 * -2 + 1) * 4);
  }
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}